

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SourceManager.cpp
# Opt level: O1

SourceLocation __thiscall
slang::SourceManager::getExpansionLoc(SourceManager *this,SourceLocation location)

{
  variant_alternative_t<1UL,_variant<FileInfo,_ExpansionInfo>_> *pvVar1;
  SourceLocation SVar2;
  
  std::__shared_mutex_pthread::lock_shared((__shared_mutex_pthread *)this);
  if (((ulong)location & 0xfffffff) == 0) {
    SVar2 = (SourceLocation)0x0;
  }
  else {
    pvVar1 = std::get<1ul,slang::SourceManager::FileInfo,slang::SourceManager::ExpansionInfo>
                       ((this->bufferEntries).
                        super__Vector_base<std::variant<slang::SourceManager::FileInfo,_slang::SourceManager::ExpansionInfo>,_std::allocator<std::variant<slang::SourceManager::FileInfo,_slang::SourceManager::ExpansionInfo>_>_>
                        ._M_impl.super__Vector_impl_data._M_start + ((ulong)location & 0xfffffff));
    SVar2 = (pvVar1->expansionRange).startLoc;
  }
  pthread_rwlock_unlock((pthread_rwlock_t *)this);
  return SVar2;
}

Assistant:

SourceLocation SourceManager::getExpansionLoc(SourceLocation location) const {
    std::shared_lock<std::shared_mutex> lock(mutex);
    return getExpansionRangeImpl(location, lock).start();
}